

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O2

rect_i agge::renderer::
       adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
       ::make_window(bitmap<unsigned_char,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  rect_i rVar6;
  
  uVar5 = (ulong)offset >> 0x20;
  uVar3 = offset.dx;
  iVar4 = bitmap_->_width + uVar3;
  iVar2 = bitmap_->_height + offset.dy;
  if (window != (rect_i *)0x0) {
    uVar1 = window->x1;
    if (window->x1 <= (int)uVar3) {
      uVar1 = uVar3;
    }
    if (offset.dy < window->y1) {
      uVar5 = (ulong)(uint)window->y1;
    }
    if (window->x2 <= iVar4) {
      iVar4 = window->x2;
    }
    if (window->y2 <= iVar2) {
      iVar2 = window->y2;
    }
    offset.dy = 0;
    offset.dx = uVar1;
  }
  rVar6._0_8_ = (ulong)offset & 0xffffffff | uVar5 << 0x20;
  rVar6.y2 = iVar2;
  rVar6.x2 = iVar4;
  return rVar6;
}

Assistant:

inline rect_i renderer::adapter<BitmapT, BlenderT>::make_window(BitmapT &bitmap_, vector_i offset,
		const rect_i * window)
	{
		rect_i w = {
			offset.dx, offset.dy,
			static_cast<int>(bitmap_.width()) + offset.dx, static_cast<int>(bitmap_.height()) + offset.dy
		};

		if (window)
		{
			update_max(w.x1, window->x1);
			update_max(w.y1, window->y1);
			update_min(w.x2, window->x2);
			update_min(w.y2, window->y2);
		}
		return w;
	}